

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O0

void duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::InitializeFileScanState
               (ClientContext *context,MultiFileReaderData *reader_data,MultiFileLocalState *lstate,
               vector<unsigned_long,_true> *projection_ids)

{
  ulong uVar1;
  bool bVar2;
  BaseFileReader *this;
  idx_t iVar3;
  MultiFileLocalColumnId *pMVar4;
  undefined8 in_RCX;
  long in_RDX;
  MultiFileReaderData *in_RSI;
  vector *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  iterator __end3_1;
  iterator __begin3_1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range3_1;
  unsigned_long *id;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_true> *__range3;
  ExpressionExecutor *executor;
  value_type *col;
  iterator expr_entry;
  iterator cast_entry;
  MultiFileLocalColumnId local_id;
  MultiFileLocalIndex local_idx;
  idx_t i;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_columns;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *local_column_ids;
  vector<duckdb::LogicalType,_true> intermediate_chunk_types;
  BaseFileReader *reader;
  Expression *in_stack_fffffffffffffe58;
  MultiFileLocalIndex in_stack_fffffffffffffe60;
  value_type *in_stack_fffffffffffffe68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_fffffffffffffe70;
  Expression *pEVar5;
  shared_ptr<duckdb::BaseFileReader,_true> *in_stack_fffffffffffffe78;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_f8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_f0;
  reference local_e8;
  unsigned_long *local_e0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d8;
  undefined8 local_d0;
  Expression *local_c8;
  const_reference local_c0;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_false>
  local_b8;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false> local_b0;
  idx_t local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_false>
  local_a0;
  idx_t local_98;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false> local_90;
  idx_t local_88;
  undefined8 local_80;
  MultiFileLocalIndex local_78;
  ulong local_70;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_58;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *local_50;
  undefined1 local_48 [24];
  type local_30;
  optional_ptr<duckdb::MultiFileReaderData,_true> local_28;
  undefined8 local_20;
  long local_18;
  MultiFileReaderData *local_10;
  vector *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  shared_ptr<duckdb::BaseFileReader,_true>::operator=
            (in_stack_fffffffffffffe78,
             (shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffe70);
  optional_ptr<duckdb::MultiFileReaderData,_true>::optional_ptr(&local_28,local_10);
  *(MultiFileReaderData **)(local_18 + 0x18) = local_28.ptr;
  local_30 = shared_ptr<duckdb::BaseFileReader,_true>::operator*
                       ((shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffe60.index)
  ;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x65431f);
  local_50 = &local_30->column_ids;
  this = shared_ptr<duckdb::BaseFileReader,_true>::operator->
                   ((shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffe60.index);
  local_58 = BaseFileReader::GetColumns(this);
  for (local_70 = 0; uVar1 = local_70,
      iVar3 = MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId>::size
                        ((MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *)0x65439e),
      uVar1 < iVar3; local_70 = local_70 + 1) {
    MultiFileLocalIndex::MultiFileLocalIndex(&local_78,local_70);
    local_88 = local_78.index;
    pMVar4 = MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId>::operator[]
                       ((MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *)
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
    local_80 = *(undefined8 *)pMVar4;
    local_98 = MultiFileLocalColumnId::operator_cast_to_unsigned_long
                         ((MultiFileLocalColumnId *)&local_80);
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_duckdb::LogicalType,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>_>
         ::find((unordered_map<unsigned_long,_duckdb::LogicalType,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>_>
                 *)in_stack_fffffffffffffe58,(key_type *)0x65445a);
    local_a8 = MultiFileLocalColumnId::operator_cast_to_unsigned_long
                         ((MultiFileLocalColumnId *)&local_80);
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
         ::find((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                 *)in_stack_fffffffffffffe58,(key_type *)0x6544b4);
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_duckdb::LogicalType,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>_>
         ::end((unordered_map<unsigned_long,_duckdb::LogicalType,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>_>
                *)in_stack_fffffffffffffe58);
    bVar2 = std::__detail::operator!=(&local_90,&local_b0);
    if (bVar2) {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false,_false>
                  *)0x65450c);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    else {
      local_b8._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
           ::end((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                  *)in_stack_fffffffffffffe58);
      bVar2 = std::__detail::operator!=(&local_a0,&local_b8);
      if (bVar2) {
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_false,_false>
                      *)0x654591);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe60.index);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
      else {
        MultiFileLocalColumnId::operator_cast_to_unsigned_long((MultiFileLocalColumnId *)&local_80);
        local_c0 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                             ((vector<duckdb::MultiFileColumnDefinition,_true> *)
                              in_stack_fffffffffffffe60.index,(size_type)in_stack_fffffffffffffe58);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
    }
  }
  duckdb::DataChunk::Destroy();
  duckdb::DataChunk::Initialize((ClientContext *)(local_18 + 0x40),local_8,(ulong)local_48);
  local_c8 = (Expression *)(local_18 + 0x80);
  duckdb::ExpressionExecutor::ClearExpressions();
  bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffe70);
  if (bVar2) {
    local_f0 = &local_10->expressions;
    local_f8._M_current =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
         std::
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe58);
    std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           *)in_stack_fffffffffffffe58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe60.index,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe58), bVar2) {
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator*(&local_f8);
      in_stack_fffffffffffffe58 = local_c8;
      in_stack_fffffffffffffe60.index =
           (idx_t)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(in_stack_fffffffffffffe60.index);
      duckdb::ExpressionExecutor::AddExpression(in_stack_fffffffffffffe58);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator++(&local_f8);
    }
  }
  else {
    local_d0 = local_20;
    local_d8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffe58);
    local_e0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffe60.index,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffe58), bVar2) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_d8);
      pEVar5 = local_c8;
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffe60.index,(size_type)in_stack_fffffffffffffe58);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe60.index);
      duckdb::ExpressionExecutor::AddExpression(pEVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_d8);
    }
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x654842);
  return;
}

Assistant:

static void InitializeFileScanState(ClientContext &context, MultiFileReaderData &reader_data,
	                                    MultiFileLocalState &lstate, vector<idx_t> &projection_ids) {
		lstate.reader = reader_data.reader;
		lstate.reader_data = reader_data;
		auto &reader = *lstate.reader;
		//! Initialize the intermediate chunk to be used by the underlying reader before being finalized
		vector<LogicalType> intermediate_chunk_types;
		auto &local_column_ids = reader.column_ids;
		auto &local_columns = lstate.reader->GetColumns();
		for (idx_t i = 0; i < local_column_ids.size(); i++) {
			auto local_idx = MultiFileLocalIndex(i);
			auto local_id = local_column_ids[local_idx];
			auto cast_entry = reader.cast_map.find(local_id);
			auto expr_entry = reader.expression_map.find(local_id);
			if (cast_entry != reader.cast_map.end()) {
				intermediate_chunk_types.push_back(cast_entry->second);
			} else if (expr_entry != reader.expression_map.end()) {
				intermediate_chunk_types.push_back(expr_entry->second->return_type);
			} else {
				auto &col = local_columns[local_id];
				intermediate_chunk_types.push_back(col.type);
			}
		}
		lstate.scan_chunk.Destroy();
		lstate.scan_chunk.Initialize(context, intermediate_chunk_types);

		auto &executor = lstate.executor;
		executor.ClearExpressions();
		if (!projection_ids.empty()) {
			for (auto &id : projection_ids) {
				executor.AddExpression(*reader_data.expressions[id]);
			}
		} else {
			for (auto &expr : reader_data.expressions) {
				executor.AddExpression(*expr);
			}
		}
	}